

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O3

bool __thiscall
CServerBrowserFavorites::AddFavoriteEx
          (CServerBrowserFavorites *this,char *pHostname,NETADDR *pAddr,bool DoCheck,char *pPassword
          )

{
  NETADDR *pNVar1;
  undefined8 uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  int iVar7;
  long lVar8;
  CFavoriteServer *pCVar9;
  int *piVar10;
  bool bVar11;
  char *pcVar12;
  long lVar13;
  long in_FS_OFFSET;
  bool bVar14;
  char aBuf [256];
  char local_138 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (long)this->m_NumFavoriteServers;
  if (lVar8 == 0x100) {
LAB_0012bf4d:
    bVar11 = false;
  }
  else {
    if (0 < this->m_NumFavoriteServers) {
      pcVar12 = this->m_aFavoriteServers[0].m_aPassword;
      lVar13 = 0;
      do {
        iVar7 = str_comp(pHostname,(char *)(pcVar12 + -0x80));
        if (iVar7 == 0) {
          if (pPassword == (char *)0x0) {
            *pcVar12 = '\0';
          }
          else {
            str_copy(pcVar12,pPassword,0x20);
          }
          goto LAB_0012bf4d;
        }
        lVar13 = lVar13 + 1;
        lVar8 = (long)this->m_NumFavoriteServers;
        pcVar12 = pcVar12 + 0xbc;
      } while (lVar13 < lVar8);
    }
    iVar7 = net_addr_from_str(&this->m_aFavoriteServers[lVar8].m_Addr,pHostname);
    lVar8 = (long)this->m_NumFavoriteServers;
    bVar14 = iVar7 == 0;
    if (bVar14) {
      bVar11 = false;
      pCVar9 = FindFavoriteByAddr(this,&this->m_aFavoriteServers[lVar8].m_Addr,(int *)0x0);
      if (pCVar9 != (CFavoriteServer *)0x0) goto LAB_0012c151;
      if (DoCheck) {
        iVar7 = net_addr_comp(&this->m_aFavoriteServers[this->m_NumFavoriteServers].m_Addr,pAddr,1);
        if (iVar7 != 0) goto LAB_0012bf4d;
      }
      lVar8 = (long)this->m_NumFavoriteServers;
      this->m_aFavoriteServers[lVar8].m_State = 3;
    }
    else {
      piVar10 = &this->m_aFavoriteServers[lVar8].m_State;
      if (DoCheck) {
        *piVar10 = 1;
        *(undefined8 *)(this->m_aFavoriteServers[lVar8].m_Addr.ip + 0xc) =
             *(undefined8 *)(pAddr->ip + 0xc);
        uVar3 = pAddr->ip[0];
        uVar4 = pAddr->ip[1];
        uVar5 = pAddr->ip[2];
        uVar6 = pAddr->ip[3];
        uVar2 = *(undefined8 *)(pAddr->ip + 4);
        pNVar1 = &this->m_aFavoriteServers[lVar8].m_Addr;
        pNVar1->type = pAddr->type;
        pNVar1->ip[0] = uVar3;
        pNVar1->ip[1] = uVar4;
        pNVar1->ip[2] = uVar5;
        pNVar1->ip[3] = uVar6;
        *(undefined8 *)(pNVar1->ip + 4) = uVar2;
      }
      else {
        *piVar10 = 0;
      }
      piVar10 = &(this->m_FavLookup).m_LookupCount;
      *piVar10 = *piVar10 + 1;
    }
    str_copy(this->m_aFavoriteServers[lVar8].m_aHostname,pHostname,0x80);
    iVar7 = this->m_NumFavoriteServers;
    pcVar12 = this->m_aFavoriteServers[iVar7].m_aPassword;
    if (pPassword == (char *)0x0) {
      *pcVar12 = '\0';
    }
    else {
      str_copy(pcVar12,pPassword,0x20);
      iVar7 = this->m_NumFavoriteServers;
    }
    this->m_NumFavoriteServers = iVar7 + 1;
    bVar11 = bVar14;
    if (this->m_pConfig->m_Debug != 0) {
      str_format(local_138,0x100,"added fav \'%s\'",pHostname);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,2,"client_srvbrowse",local_138,0);
    }
  }
LAB_0012c151:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool CServerBrowserFavorites::AddFavoriteEx(const char *pHostname, const NETADDR *pAddr, bool DoCheck, const char *pPassword)
{
	if(m_NumFavoriteServers == MAX_FAVORITES)
		return false;

	CFavoriteServer *pExistingFavorite = FindFavoriteByHostname(pHostname, 0);
	if(pExistingFavorite)
	{
		if(pPassword)
			str_copy(pExistingFavorite->m_aPassword, pPassword, sizeof(pExistingFavorite->m_aPassword));
		else
			pExistingFavorite->m_aPassword[0] = '\0';
		return false;
	}

	bool Result = false;
	// check if hostname is a net address string
	if(net_addr_from_str(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, pHostname) == 0)
	{
		// make sure that we don't already have the server in our list
		if(FindFavoriteByAddr(m_aFavoriteServers[m_NumFavoriteServers].m_Addr, 0) != 0)
			return false;

		// check if hostname does not match given address
		if(DoCheck && net_addr_comp(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, pAddr, true) != 0)
			return false;

		// add the server to the list
		m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_ADDR;
		Result = true;
	}
	else
	{
		// prepare for hostname lookup
		if(DoCheck)
		{
			m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_LOOKUPCHECK;
			m_aFavoriteServers[m_NumFavoriteServers].m_Addr = *pAddr;
		}
		else
			m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_LOOKUP;
		++m_FavLookup.m_LookupCount;
	}

	str_copy(m_aFavoriteServers[m_NumFavoriteServers].m_aHostname, pHostname, sizeof(m_aFavoriteServers[m_NumFavoriteServers].m_aHostname));

	if(pPassword)
		str_copy(m_aFavoriteServers[m_NumFavoriteServers].m_aPassword, pPassword, sizeof(m_aFavoriteServers[m_NumFavoriteServers].m_aPassword));
	else
		m_aFavoriteServers[m_NumFavoriteServers].m_aPassword[0] = '\0';

	++m_NumFavoriteServers;

	if(m_pConfig->m_Debug)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "added fav '%s'", pHostname);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", aBuf);
	}

	return Result;
}